

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O0

void __thiscall
fuzzFailures_timeoutSingleProblems_Test::TestBody(fuzzFailures_timeoutSingleProblems_Test *this)

{
  bool bVar1;
  char *pcVar2;
  precise_unit *un;
  uint64_t uVar3;
  uint64_t in_RCX;
  char *in_R9;
  precise_unit pVar4;
  string local_208;
  AssertHelper local_1e8;
  Message local_1e0;
  bool local_1d1;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_1a0 [8];
  precise_unit u2;
  string str;
  AssertHelper local_150;
  Message local_148 [6];
  exception *e;
  double local_f8;
  undefined8 local_f0;
  undefined1 auStack_e8 [8];
  TrueWithString gtest_msg;
  precise_unit val;
  string local_b0;
  AssertHelper local_90;
  Message local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string cdata;
  fuzzFailures_timeoutSingleProblems_Test *this_local;
  
  cdata.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"timeout",&local_51);
  loadFailureFile((string *)local_30,&local_50,0x1c);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_79 = (bool)std::__cxx11::string::empty();
  local_79 = (bool)(local_79 ^ 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)local_78,(AssertionResult *)"cdata.empty()","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    in_RCX = 0x56;
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (bVar1) {
    units::precise_unit::precise_unit((precise_unit *)((long)&gtest_msg.value.field_2 + 8));
    gtest_msg.value._M_string_length = 0;
    gtest_msg.value.field_2._M_allocated_capacity = 0;
    auStack_e8 = (undefined1  [8])0x0;
    gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
    gtest_msg.value._1_7_ = 0;
    testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_e8);
    bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_e8);
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        std::__cxx11::string::string((string *)&e,(string *)local_30);
        uVar3 = units::getDefaultFlags();
        pVar4 = units::unit_from_string((string *)&e,uVar3);
        local_f0 = pVar4._8_8_;
        local_f8 = pVar4.multiplier_;
        gtest_msg.value.field_2._8_8_ = local_f8;
        std::__cxx11::string::~string((string *)&e);
      }
    }
    else {
      testing::Message::Message(local_148);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&str.field_2 + 8),
                     "Expected: val = unit_from_string(cdata) doesn\'t throw an exception.\n  Actual: "
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_e8);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      in_RCX = 0x58;
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                 ,0x58,pcVar2);
      testing::internal::AssertHelper::operator=(&local_150,local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      std::__cxx11::string::~string((string *)(str.field_2._M_local_buf + 8));
      testing::Message::~Message(local_148);
    }
    testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_e8);
    bVar1 = units::is_error((precise_unit *)((long)&gtest_msg.value.field_2 + 8));
    if (!bVar1) {
      un = (precise_unit *)units::getDefaultFlags();
      units::to_string_abi_cxx11_
                ((string *)&u2.base_units_,(units *)(gtest_msg.value.field_2._M_local_buf + 8),un,
                 in_RCX);
      std::__cxx11::string::string((string *)&gtest_ar__1.message_,(string *)&u2.base_units_);
      uVar3 = units::getDefaultFlags();
      pVar4 = units::unit_from_string((string *)&gtest_ar__1.message_,uVar3);
      u2.multiplier_ = pVar4._8_8_;
      local_1a0 = (undefined1  [8])pVar4.multiplier_;
      std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
      bVar1 = units::is_error((precise_unit *)local_1a0);
      local_1d1 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1d0,&local_1d1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
      if (!bVar1) {
        testing::Message::Message(&local_1e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_208,(internal *)local_1d0,(AssertionResult *)"is_error(u2)","true","false"
                   ,in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
                   ,0x5c,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
        testing::internal::AssertHelper::~AssertHelper(&local_1e8);
        std::__cxx11::string::~string((string *)&local_208);
        testing::Message::~Message(&local_1e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
      std::__cxx11::string::~string((string *)&u2.base_units_);
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(fuzzFailures, timeoutSingleProblems)
{
    auto cdata = loadFailureFile("timeout", 28);
    ASSERT_FALSE(cdata.empty());
    precise_unit val;
    EXPECT_NO_THROW(val = unit_from_string(cdata));
    if (!is_error(val)) {
        auto str = to_string(val);
        auto u2 = unit_from_string(str);
        EXPECT_FALSE(is_error(u2));
    }
}